

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall Parser::error<char_const(&)[27]>(Parser *this,char (*args) [27])

{
  Token *pTVar1;
  pointer pcVar2;
  char buf [4096];
  char acStack_1008 [4096];
  
  sprintf(acStack_1008,*args);
  pTVar1 = this->tok;
  pcVar2 = (this->lex_data->fn)._M_dataplus._M_p;
  if (pTVar1 == (Token *)0x0) {
    printf("%s: %s\n",pcVar2,acStack_1008);
  }
  else {
    printf("%s:%d:%d: %s\n",pcVar2,(ulong)(uint)(pTVar1->pos).line,(ulong)(uint)(pTVar1->pos).col,
           acStack_1008);
  }
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    if (tok) {
      std::printf("%s:%d:%d: %s\n",
                  lex_data->fn.c_str(),
                  tok->pos.line,
                  tok->pos.col,
                  buf);
    }
    else {
      std::printf("%s: %s\n",
                  lex_data->fn.c_str(),
                  buf);
    }
    std::exit(1);
  }